

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

void __thiscall rengine::OpenGLRenderer::TexturePool::~TexturePool(TexturePool *this)

{
  size_type sVar1;
  uint *puVar2;
  TexturePool *this_local;
  
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  puVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  glDeleteTextures(sVar1 & 0xffffffff,puVar2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

~TexturePool()
        {
            glDeleteTextures(size(), data());
        }